

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_read.cpp
# Opt level: O0

string * GetPathOrURLShortName(string *strFullName)

{
  ulong uVar1;
  string *in_RSI;
  size_type iPos;
  string local_78 [39];
  allocator local_51;
  string local_50 [55];
  allocator local_19 [9];
  string *strFullName_local;
  
  strFullName_local = strFullName;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"/",&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"\\",(allocator *)((long)&iPos + 7));
    string_replace(in_RSI,(string *)local_50,(string *)local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)((long)&iPos + 7));
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    std::__cxx11::string::find_last_of((char)in_RSI,0x5c);
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)strFullName,(ulong)in_RSI);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)strFullName,"",local_19);
    std::allocator<char>::~allocator((allocator<char> *)local_19);
  }
  return strFullName;
}

Assistant:

std::string GetPathOrURLShortName(std::string strFullName)
{
	if (strFullName.empty())
	{
		return "";
	}

	string_replace(strFullName, "/", "\\");

	std::string::size_type iPos = strFullName.find_last_of('\\') + 1;

	return strFullName.substr(iPos, strFullName.length() - iPos);
}